

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

vm_obj_id_t CVmObjFile::create(int in_root_set)

{
  vm_obj_id_t obj_id;
  undefined8 *puVar1;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,1,0);
  puVar1 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar1 = &PTR_get_metaclass_reg_00363f38;
  puVar1[1] = 0;
  *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
       *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFile::create(VMG_ int in_root_set)
{
    /* instantiate the object */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    new (vmg_ id) CVmObjFile();

    /* files are always transient */
    G_obj_table->set_obj_transient(id);

    /* return the new ID */
    return id;
}